

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O0

void V_SetAllCmp(Vector *V,Real Val)

{
  Real *pRVar1;
  Real *pRVar2;
  LASErrIdType LVar3;
  Real *VCmp;
  size_t Ind;
  size_t Dim;
  Real Val_local;
  Vector *V_local;
  
  LVar3 = LASResult();
  if (LVar3 == LASOK) {
    pRVar1 = (Real *)V->Dim;
    pRVar2 = V->Cmp;
    for (VCmp = (Real *)0x1; VCmp <= pRVar1; VCmp = (Real *)((long)VCmp + 1)) {
      pRVar2[(long)VCmp] = Val;
    }
    V->Multipl = 1.0;
  }
  return;
}

Assistant:

void V_SetAllCmp(Vector *V, Real Val)
/* set all vector components equal Val */
{
    size_t Dim, Ind;
    Real *VCmp;

    if (LASResult() == LASOK) {
        Dim = V->Dim;
        VCmp = V->Cmp;
        for(Ind = 1; Ind <= Dim; Ind++)
            VCmp[Ind] = Val;
        V->Multipl = 1.0;
    }
}